

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O2

void __thiscall
phmap::priv::
raw_hash_set<phmap::priv::(anonymous_namespace)::IntPolicy,_phmap::Hash<long>,_std::equal_to<long>,_phmap::priv::(anonymous_namespace)::CustomAlloc<long>_>
::~raw_hash_set(raw_hash_set<phmap::priv::(anonymous_namespace)::IntPolicy,_phmap::Hash<long>,_std::equal_to<long>,_phmap::priv::(anonymous_namespace)::CustomAlloc<long>_>
                *this)

{
  Layout LVar1;
  
  if (this->capacity_ != 0) {
    LVar1 = MakeLayout(this->capacity_);
    Deallocate<8ul,phmap::priv::(anonymous_namespace)::CustomAlloc<long>>
              ((CustomAlloc<long> *)this->ctrl_,
               (void *)((LVar1.super_LayoutType<sizeof___(Ts),_signed_char,_long>.size_[0] + 7 &
                        0xfffffffffffffff8) +
                       LVar1.super_LayoutType<sizeof___(Ts),_signed_char,_long>.size_[1] * 8),
               LVar1.super_LayoutType<sizeof___(Ts),_signed_char,_long>.size_[1]);
    (this->settings_).
    super__Tuple_impl<0UL,_unsigned_long,_phmap::Hash<long>,_std::equal_to<long>,_phmap::priv::(anonymous_namespace)::CustomAlloc<long>_>
    .super__Head_base<0UL,_unsigned_long,_false>._M_head_impl = 0;
    this->ctrl_ = (ctrl_t *)0x0;
    this->slots_ = (slot_type *)0x0;
    this->size_ = 0;
    this->capacity_ = 0;
  }
  return;
}

Assistant:

~raw_hash_set() { destroy_slots(); }